

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall
S2Polygon::InitNested
          (S2Polygon *this,
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          *loops)

{
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  *this_00;
  iterator __begin1;
  pointer puVar1;
  pointer puVar2;
  S2Polygon *this_01;
  int i;
  long lVar3;
  LoopMap loop_map;
  _Rb_tree<S2Loop_*,_std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>,_std::_Select1st<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
  local_50;
  
  ClearLoops(this);
  this_00 = &this->loops_;
  this_01 = (S2Polygon *)this_00;
  std::
  _Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::_Vector_impl_data::_M_swap_data((_Vector_impl_data *)this_00,(_Vector_impl_data *)loops);
  puVar1 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)puVar2 - (long)puVar1 & 0x7fffffff8U) == 8) {
    InitOneLoop(this);
    return;
  }
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar3 = 0; lVar3 < (int)((ulong)((long)puVar2 - (long)puVar1) >> 3); lVar3 = lVar3 + 1) {
    InsertLoop(this_01,puVar1[lVar3]._M_t.
                       super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
                       super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl,(S2Loop *)0x0,
               (LoopMap *)&local_50);
    puVar1 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; puVar1 != puVar2; puVar1 = puVar1 + 1) {
    (puVar1->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
    super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
    super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl = (S2Loop *)0x0;
  }
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::clear(this_00);
  InitLoops(this,(LoopMap *)&local_50);
  InitLoopProperties(this);
  std::
  _Rb_tree<S2Loop_*,_std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>,_std::_Select1st<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void S2Polygon::InitNested(vector<unique_ptr<S2Loop>> loops) {
  ClearLoops();
  loops_.swap(loops);

  if (num_loops() == 1) {
    InitOneLoop();
    return;
  }
  LoopMap loop_map;
  for (int i = 0; i < num_loops(); ++i) {
    InsertLoop(loop(i), nullptr, &loop_map);
  }
  // Reorder the loops in depth-first traversal order.
  // Loops are now owned by loop_map, don't let them be
  // deleted by clear().
  for (auto& loop : loops_) loop.release();
  loops_.clear();
  InitLoops(&loop_map);

  // Compute num_vertices_, bound_, subregion_bound_.
  InitLoopProperties();
}